

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_mem.c
# Opt level: O0

long mem_ctrl(BIO *b,int cmd,long num,void *ptr)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  long *in_RCX;
  BIO *in_RDX;
  int in_ESI;
  long in_RDI;
  long remain;
  long off;
  BUF_MEM *bo;
  BUF_MEM *bm;
  BIO_BUF_MEM *bbm;
  char **pptr;
  long ret;
  long local_78;
  BIO *local_58;
  long *local_50;
  long *local_48;
  BIO *local_30;
  
  local_30 = (BIO *)0x1;
  plVar1 = *(long **)(in_RDI + 0x40);
  if ((*(uint *)(in_RDI + 0x30) & 0x200) == 0) {
    local_48 = (long *)plVar1[1];
    local_50 = (long *)*plVar1;
  }
  else {
    local_48 = (long *)*plVar1;
    local_50 = (long *)plVar1[1];
  }
  if (local_48[1] == local_50[1]) {
    local_58 = (BIO *)0x0;
  }
  else {
    local_58 = (BIO *)(local_48[1] - local_50[1]);
  }
  uVar4 = SUB84(in_RDX,0);
  switch((BIO *)(ulong)(in_ESI - 1)) {
  case (BIO *)0x0:
    puVar2 = (undefined8 *)*plVar1;
    if (puVar2[1] != 0) {
      if ((*(uint *)(in_RDI + 0x30) & 0x200) == 0) {
        if ((*(uint *)(in_RDI + 0x30) & 0x400) == 0) {
          memset((void *)puVar2[1],0,puVar2[2]);
          *puVar2 = 0;
        }
        puVar2 = (undefined8 *)plVar1[1];
        puVar3 = (undefined8 *)*plVar1;
        *puVar2 = *puVar3;
        puVar2[1] = puVar3[1];
        puVar2[2] = puVar3[2];
        puVar2[3] = puVar3[3];
      }
      else {
        puVar2 = (undefined8 *)*plVar1;
        puVar3 = (undefined8 *)plVar1[1];
        *puVar2 = *puVar3;
        puVar2[1] = puVar3[1];
        puVar2[2] = puVar3[2];
        puVar2[3] = puVar3[3];
      }
    }
    break;
  case (BIO *)0x1:
    local_30 = (BIO *)(long)(int)(uint)(*local_48 == 0);
    break;
  case (BIO *)0x2:
    local_30 = (BIO *)*local_48;
    if (in_RCX != (long *)0x0) {
      *in_RCX = local_48[1];
    }
    break;
  case (BIO *)0x5:
  case (BIO *)0x6:
  default:
    local_30 = (BIO *)0x0;
    break;
  case (BIO *)0x7:
    local_30 = (BIO *)(long)*(int *)(in_RDI + 0x2c);
    break;
  case (BIO *)0x8:
    *(undefined4 *)(in_RDI + 0x2c) = uVar4;
    break;
  case (BIO *)0x9:
    local_30 = (BIO *)*local_48;
    break;
  case (BIO *)0xa:
  case (BIO *)0xb:
    local_30 = (BIO *)0x1;
    break;
  case (BIO *)0xc:
    local_30 = (BIO *)0x0;
    break;
  case (BIO *)0x71:
    mem_buf_free(local_58);
    *(undefined4 *)(in_RDI + 0x2c) = uVar4;
    *plVar1 = (long)in_RCX;
    puVar2 = (undefined8 *)plVar1[1];
    puVar3 = (undefined8 *)*plVar1;
    *puVar2 = *puVar3;
    puVar2[1] = puVar3[1];
    puVar2[2] = puVar3[2];
    puVar2[3] = puVar3[3];
    break;
  case (BIO *)0x72:
    if (in_RCX != (long *)0x0) {
      if ((*(uint *)(in_RDI + 0x30) & 0x200) == 0) {
        mem_buf_sync((BIO *)(ulong)(in_ESI - 1));
      }
      *in_RCX = *plVar1;
    }
    break;
  case (BIO *)0x7f:
    if (((long)in_RDX < 0) || ((long)&local_58->libctx + *local_48 < (long)in_RDX)) {
      return -1;
    }
    if (in_RDX == (BIO *)0x0) {
      local_78 = local_50[1];
    }
    else {
      local_78 = (long)&in_RDX->libctx + local_50[1];
    }
    local_48[1] = local_78;
    *local_48 = *local_50 - (long)in_RDX;
    local_48[2] = local_50[2] - (long)in_RDX;
    local_58 = in_RDX;
  case (BIO *)0x84:
    local_30 = local_58;
    break;
  case (BIO *)0x81:
    *(undefined4 *)(in_RDI + 0x38) = uVar4;
  }
  return (long)local_30;
}

Assistant:

static long mem_ctrl(BIO *b, int cmd, long num, void *ptr)
{
    long ret = 1;
    char **pptr;
    BIO_BUF_MEM *bbm = (BIO_BUF_MEM *)b->ptr;
    BUF_MEM *bm, *bo;            /* bio_mem, bio_other */
    long off, remain;

    if (b->flags & BIO_FLAGS_MEM_RDONLY) {
        bm = bbm->buf;
        bo = bbm->readp;
    } else {
        bm = bbm->readp;
        bo = bbm->buf;
    }
    off = (bm->data == bo->data) ? 0 : bm->data - bo->data;
    remain = bm->length;

    switch (cmd) {
    case BIO_CTRL_RESET:
        bm = bbm->buf;
        if (bm->data != NULL) {
            if (!(b->flags & BIO_FLAGS_MEM_RDONLY)) {
                if (!(b->flags & BIO_FLAGS_NONCLEAR_RST)) {
                    memset(bm->data, 0, bm->max);
                    bm->length = 0;
                }
                *bbm->readp = *bbm->buf;
            } else {
                /* For read only case just reset to the start again */
                *bbm->buf = *bbm->readp;
            }
        }
        break;
    case BIO_C_FILE_SEEK:
        if (num < 0 || num > off + remain)
            return -1;   /* Can't see outside of the current buffer */

        bm->data = (num != 0) ? bo->data + num : bo->data;
        bm->length = bo->length - num;
        bm->max = bo->max - num;
        off = num;
        /* FALLTHRU */
    case BIO_C_FILE_TELL:
        ret = off;
        break;
    case BIO_CTRL_EOF:
        ret = (long)(bm->length == 0);
        break;
    case BIO_C_SET_BUF_MEM_EOF_RETURN:
        b->num = (int)num;
        break;
    case BIO_CTRL_INFO:
        ret = (long)bm->length;
        if (ptr != NULL) {
            pptr = (char **)ptr;
            *pptr = (char *)(bm->data);
        }
        break;
    case BIO_C_SET_BUF_MEM:
        mem_buf_free(b);
        b->shutdown = (int)num;
        bbm->buf = ptr;
        *bbm->readp = *bbm->buf;
        break;
    case BIO_C_GET_BUF_MEM_PTR:
        if (ptr != NULL) {
            if (!(b->flags & BIO_FLAGS_MEM_RDONLY))
                mem_buf_sync(b);
            bm = bbm->buf;
            pptr = (char **)ptr;
            *pptr = (char *)bm;
        }
        break;
    case BIO_CTRL_GET_CLOSE:
        ret = (long)b->shutdown;
        break;
    case BIO_CTRL_SET_CLOSE:
        b->shutdown = (int)num;
        break;
    case BIO_CTRL_WPENDING:
        ret = 0L;
        break;
    case BIO_CTRL_PENDING:
        ret = (long)bm->length;
        break;
    case BIO_CTRL_DUP:
    case BIO_CTRL_FLUSH:
        ret = 1;
        break;
    case BIO_CTRL_PUSH:
    case BIO_CTRL_POP:
    default:
        ret = 0;
        break;
    }
    return ret;
}